

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_misc.c
# Opt level: O1

void pcre2_jit_stack_free_8(pcre2_jit_stack_8 *jit_stack)

{
  return;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_jit_stack_free(pcre2_jit_stack *jit_stack)
{
#ifndef SUPPORT_JIT
(void)jit_stack;
#else  /* SUPPORT_JIT */
if (jit_stack != NULL)
  {
  sljit_free_stack((struct sljit_stack *)(jit_stack->stack), &jit_stack->memctl);
  jit_stack->memctl.free(jit_stack, jit_stack->memctl.memory_data);
  }
#endif  /* SUPPORT_JIT */
}